

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O2

Result __thiscall wabt::ExprVisitor::HandleDefaultState(ExprVisitor *this,Expr *expr)

{
  Delegate *pDVar1;
  int iVar2;
  State state;
  Enum EVar3;
  LoadStoreExpr<(wabt::ExprType)0> *pLVar4;
  VarExpr<(wabt::ExprType)43> *pVVar5;
  SimdLaneOpExpr *pSVar6;
  OpcodeExpr<(wabt::ExprType)47> *pOVar7;
  VarExpr<(wabt::ExprType)35> *pVVar8;
  VarExpr<(wabt::ExprType)36> *pVVar9;
  VarExpr<(wabt::ExprType)27> *pVVar10;
  ExprMixin<(wabt::ExprType)34> *pEVar11;
  ExprMixin<(wabt::ExprType)16> *pEVar12;
  OpcodeExpr<(wabt::ExprType)44> *pOVar13;
  ConstExpr *pCVar14;
  ReturnCallIndirectExpr *pRVar15;
  ExprMixin<(wabt::ExprType)48> *pEVar16;
  VarExpr<(wabt::ExprType)11> *pVVar17;
  LoadStoreExpr<(wabt::ExprType)4> *pLVar18;
  VarExpr<(wabt::ExprType)40> *pVVar19;
  CallIndirectExpr *pCVar20;
  VarExpr<(wabt::ExprType)9> *pVVar21;
  ExprMixin<(wabt::ExprType)25> *pEVar22;
  VarExpr<(wabt::ExprType)24> *pVVar23;
  LoadStoreExpr<(wabt::ExprType)2> *pLVar24;
  OpcodeExpr<(wabt::ExprType)15> *pOVar25;
  LoadStoreExpr<(wabt::ExprType)3> *pLVar26;
  LoadStoreExpr<(wabt::ExprType)1> *pLVar27;
  ExprMixin<(wabt::ExprType)31> *pEVar28;
  VarExpr<(wabt::ExprType)17> *pVVar29;
  ExprMixin<(wabt::ExprType)41> *pEVar30;
  LoadStoreExpr<(wabt::ExprType)5> *pLVar31;
  LoadStoreExpr<(wabt::ExprType)21> *pLVar32;
  OpcodeExpr<(wabt::ExprType)13> *pOVar33;
  OpcodeExpr<(wabt::ExprType)6> *pOVar34;
  VarExpr<(wabt::ExprType)18> *pVVar35;
  BrTableExpr *pBVar36;
  VarExpr<(wabt::ExprType)8> *pVVar37;
  ExprMixin<(wabt::ExprType)30> *pEVar38;
  VarExpr<(wabt::ExprType)32> *pVVar39;
  VarExpr<(wabt::ExprType)45> *pVVar40;
  LoadStoreExpr<(wabt::ExprType)39> *pLVar41;
  VarExpr<(wabt::ExprType)42> *pVVar42;
  ExprMixin<(wabt::ExprType)23> *pEVar43;
  ExprMixin<(wabt::ExprType)28> *pEVar44;
  ExprMixin<(wabt::ExprType)29> *pEVar45;
  SimdShuffleOpExpr *pSVar46;
  ExprMixin<(wabt::ExprType)26> *pEVar47;
  IfExceptExpr *pIVar48;
  
  switch(expr->type_) {
  case AtomicLoad:
    pDVar1 = this->delegate_;
    pLVar4 = cast<wabt::LoadStoreExpr<(wabt::ExprType)0>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x34])(pDVar1,pLVar4);
    break;
  case AtomicRmw:
    pDVar1 = this->delegate_;
    pLVar27 = cast<wabt::LoadStoreExpr<(wabt::ExprType)1>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x36])(pDVar1,pLVar27);
    break;
  case AtomicRmwCmpxchg:
    pDVar1 = this->delegate_;
    pLVar24 = cast<wabt::LoadStoreExpr<(wabt::ExprType)2>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x37])(pDVar1,pLVar24);
    break;
  case AtomicStore:
    pDVar1 = this->delegate_;
    pLVar26 = cast<wabt::LoadStoreExpr<(wabt::ExprType)3>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x35])(pDVar1,pLVar26);
    break;
  case AtomicWait:
    pDVar1 = this->delegate_;
    pLVar18 = cast<wabt::LoadStoreExpr<(wabt::ExprType)4>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x32])(pDVar1,pLVar18);
    break;
  case AtomicWake:
    pDVar1 = this->delegate_;
    pLVar31 = cast<wabt::LoadStoreExpr<(wabt::ExprType)5>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x33])(pDVar1,pLVar31);
    break;
  case Binary:
    pDVar1 = this->delegate_;
    pOVar34 = cast<wabt::OpcodeExpr<(wabt::ExprType)6>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[2])(pDVar1,pOVar34);
    break;
  case Block:
    pIVar48 = (IfExceptExpr *)cast<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Expr>(expr);
    iVar2 = (*this->delegate_->_vptr_Delegate[3])(this->delegate_,pIVar48);
    state = Block;
    if (iVar2 == 1) {
      return (Result)Error;
    }
    goto LAB_00d930f0;
  case Br:
    pDVar1 = this->delegate_;
    pVVar37 = cast<wabt::VarExpr<(wabt::ExprType)8>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[5])(pDVar1,pVVar37);
    break;
  case BrIf:
    pDVar1 = this->delegate_;
    pVVar21 = cast<wabt::VarExpr<(wabt::ExprType)9>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[6])(pDVar1,pVVar21);
    break;
  case BrTable:
    pDVar1 = this->delegate_;
    pBVar36 = cast<wabt::BrTableExpr,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[7])(pDVar1,pBVar36);
    break;
  case Call:
    pDVar1 = this->delegate_;
    pVVar17 = cast<wabt::VarExpr<(wabt::ExprType)11>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[8])(pDVar1,pVVar17);
    break;
  case CallIndirect:
    pDVar1 = this->delegate_;
    pCVar20 = cast<wabt::CallIndirectExpr,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[9])(pDVar1,pCVar20);
    break;
  case Compare:
    pDVar1 = this->delegate_;
    pOVar33 = cast<wabt::OpcodeExpr<(wabt::ExprType)13>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[10])(pDVar1,pOVar33);
    break;
  case Const:
    pDVar1 = this->delegate_;
    pCVar14 = cast<wabt::ConstExpr,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0xb])(pDVar1,pCVar14);
    break;
  case Convert:
    pDVar1 = this->delegate_;
    pOVar25 = cast<wabt::OpcodeExpr<(wabt::ExprType)15>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0xc])(pDVar1,pOVar25);
    break;
  case Drop:
    pDVar1 = this->delegate_;
    pEVar12 = cast<wabt::ExprMixin<(wabt::ExprType)16>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0xd])(pDVar1,pEVar12);
    break;
  case GetGlobal:
    pDVar1 = this->delegate_;
    pVVar29 = cast<wabt::VarExpr<(wabt::ExprType)17>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0xe])(pDVar1,pVVar29);
    break;
  case GetLocal:
    pDVar1 = this->delegate_;
    pVVar35 = cast<wabt::VarExpr<(wabt::ExprType)18>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0xf])(pDVar1,pVVar35);
    break;
  case If:
    pIVar48 = (IfExceptExpr *)cast<wabt::IfExpr,wabt::Expr>(expr);
    iVar2 = (*this->delegate_->_vptr_Delegate[0x10])(this->delegate_,pIVar48);
    if (iVar2 != 1) {
      state = IfTrue;
      goto LAB_00d930f0;
    }
    goto LAB_00d930c9;
  case IfExcept:
    pIVar48 = cast<wabt::IfExceptExpr,wabt::Expr>(expr);
    iVar2 = (*this->delegate_->_vptr_Delegate[0x13])(this->delegate_,pIVar48);
    if (iVar2 == 1) goto LAB_00d930c9;
    state = IfExceptTrue;
    goto LAB_00d930f0;
  case Load:
    pDVar1 = this->delegate_;
    pLVar32 = cast<wabt::LoadStoreExpr<(wabt::ExprType)21>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x16])(pDVar1,pLVar32);
    break;
  case Loop:
    pIVar48 = (IfExceptExpr *)cast<wabt::BlockExprBase<(wabt::ExprType)22>,wabt::Expr>(expr);
    iVar2 = (*this->delegate_->_vptr_Delegate[0x17])(this->delegate_,pIVar48);
    if (iVar2 == 1) goto LAB_00d930c9;
    state = Loop;
    goto LAB_00d930f0;
  case MemoryCopy:
    pDVar1 = this->delegate_;
    pEVar43 = cast<wabt::ExprMixin<(wabt::ExprType)23>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x19])(pDVar1,pEVar43);
    break;
  case MemoryDrop:
    pDVar1 = this->delegate_;
    pVVar23 = cast<wabt::VarExpr<(wabt::ExprType)24>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x1a])(pDVar1,pVVar23);
    break;
  case MemoryFill:
    pDVar1 = this->delegate_;
    pEVar22 = cast<wabt::ExprMixin<(wabt::ExprType)25>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x1b])(pDVar1,pEVar22);
    break;
  case MemoryGrow:
    pDVar1 = this->delegate_;
    pEVar47 = cast<wabt::ExprMixin<(wabt::ExprType)26>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x1c])(pDVar1,pEVar47);
    break;
  case MemoryInit:
    pDVar1 = this->delegate_;
    pVVar10 = cast<wabt::VarExpr<(wabt::ExprType)27>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x1d])(pDVar1,pVVar10);
    break;
  case MemorySize:
    pDVar1 = this->delegate_;
    pEVar44 = cast<wabt::ExprMixin<(wabt::ExprType)28>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x1e])(pDVar1,pEVar44);
    break;
  case Nop:
    pDVar1 = this->delegate_;
    pEVar45 = cast<wabt::ExprMixin<(wabt::ExprType)29>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x22])(pDVar1,pEVar45);
    break;
  case Rethrow:
    pDVar1 = this->delegate_;
    pEVar38 = cast<wabt::ExprMixin<(wabt::ExprType)30>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x31])(pDVar1,pEVar38);
    break;
  case Return:
    pDVar1 = this->delegate_;
    pEVar28 = cast<wabt::ExprMixin<(wabt::ExprType)31>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x23])(pDVar1,pEVar28);
    break;
  case ReturnCall:
    pDVar1 = this->delegate_;
    pVVar39 = cast<wabt::VarExpr<(wabt::ExprType)32>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x24])(pDVar1,pVVar39);
    break;
  case ReturnCallIndirect:
    pDVar1 = this->delegate_;
    pRVar15 = cast<wabt::ReturnCallIndirectExpr,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x25])(pDVar1,pRVar15);
    break;
  case Select:
    pDVar1 = this->delegate_;
    pEVar11 = cast<wabt::ExprMixin<(wabt::ExprType)34>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x26])(pDVar1,pEVar11);
    break;
  case SetGlobal:
    pDVar1 = this->delegate_;
    pVVar8 = cast<wabt::VarExpr<(wabt::ExprType)35>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x27])(pDVar1,pVVar8);
    break;
  case SetLocal:
    pDVar1 = this->delegate_;
    pVVar9 = cast<wabt::VarExpr<(wabt::ExprType)36>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x28])(pDVar1,pVVar9);
    break;
  case SimdLaneOp:
    pDVar1 = this->delegate_;
    pSVar6 = cast<wabt::SimdLaneOpExpr,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x39])(pDVar1,pSVar6);
    break;
  case SimdShuffleOp:
    pDVar1 = this->delegate_;
    pSVar46 = cast<wabt::SimdShuffleOpExpr,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x3a])(pDVar1,pSVar46);
    break;
  case Store:
    pDVar1 = this->delegate_;
    pLVar41 = cast<wabt::LoadStoreExpr<(wabt::ExprType)39>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x29])(pDVar1,pLVar41);
    break;
  case TableInit:
    pDVar1 = this->delegate_;
    pVVar19 = cast<wabt::VarExpr<(wabt::ExprType)40>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x21])(pDVar1,pVVar19);
    break;
  case TableCopy:
    pDVar1 = this->delegate_;
    pEVar30 = cast<wabt::ExprMixin<(wabt::ExprType)41>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x1f])(pDVar1,pEVar30);
    break;
  case TableDrop:
    pDVar1 = this->delegate_;
    pVVar42 = cast<wabt::VarExpr<(wabt::ExprType)42>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x20])(pDVar1,pVVar42);
    break;
  case TeeLocal:
    pDVar1 = this->delegate_;
    pVVar5 = cast<wabt::VarExpr<(wabt::ExprType)43>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x2a])(pDVar1,pVVar5);
    break;
  case Ternary:
    pDVar1 = this->delegate_;
    pOVar13 = cast<wabt::OpcodeExpr<(wabt::ExprType)44>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x38])(pDVar1,pOVar13);
    break;
  case Throw:
    pDVar1 = this->delegate_;
    pVVar40 = cast<wabt::VarExpr<(wabt::ExprType)45>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x30])(pDVar1,pVVar40);
    break;
  case Try:
    pIVar48 = (IfExceptExpr *)cast<wabt::TryExpr,wabt::Expr>(expr);
    iVar2 = (*this->delegate_->_vptr_Delegate[0x2d])(this->delegate_,pIVar48);
    if (iVar2 == 1) goto LAB_00d930c9;
    state = Try;
LAB_00d930f0:
    PushExprlist(this,state,expr,&(pIVar48->true_).exprs);
    goto switchD_00d92afb_default;
  case Unary:
    pDVar1 = this->delegate_;
    pOVar7 = cast<wabt::OpcodeExpr<(wabt::ExprType)47>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x2b])(pDVar1,pOVar7);
    break;
  case Last:
    pDVar1 = this->delegate_;
    pEVar16 = cast<wabt::ExprMixin<(wabt::ExprType)48>,wabt::Expr>(expr);
    iVar2 = (*pDVar1->_vptr_Delegate[0x2c])(pDVar1,pEVar16);
    break;
  default:
    goto switchD_00d92afb_default;
  }
  if (iVar2 == 1) {
LAB_00d930c9:
    EVar3 = Error;
  }
  else {
switchD_00d92afb_default:
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result ExprVisitor::HandleDefaultState(Expr* expr) {
  switch (expr->type()) {
    case ExprType::AtomicLoad:
      CHECK_RESULT(delegate_->OnAtomicLoadExpr(cast<AtomicLoadExpr>(expr)));
      break;

    case ExprType::AtomicStore:
      CHECK_RESULT(delegate_->OnAtomicStoreExpr(cast<AtomicStoreExpr>(expr)));
      break;

    case ExprType::AtomicRmw:
      CHECK_RESULT(delegate_->OnAtomicRmwExpr(cast<AtomicRmwExpr>(expr)));
      break;

    case ExprType::AtomicRmwCmpxchg:
      CHECK_RESULT(
          delegate_->OnAtomicRmwCmpxchgExpr(cast<AtomicRmwCmpxchgExpr>(expr)));
      break;

    case ExprType::AtomicWait:
      CHECK_RESULT(delegate_->OnAtomicWaitExpr(cast<AtomicWaitExpr>(expr)));
      break;

    case ExprType::AtomicWake:
      CHECK_RESULT(delegate_->OnAtomicWakeExpr(cast<AtomicWakeExpr>(expr)));
      break;

    case ExprType::Binary:
      CHECK_RESULT(delegate_->OnBinaryExpr(cast<BinaryExpr>(expr)));
      break;

    case ExprType::Block: {
      auto block_expr = cast<BlockExpr>(expr);
      CHECK_RESULT(delegate_->BeginBlockExpr(block_expr));
      PushExprlist(State::Block, expr, block_expr->block.exprs);
      break;
    }

    case ExprType::Br:
      CHECK_RESULT(delegate_->OnBrExpr(cast<BrExpr>(expr)));
      break;

    case ExprType::BrIf:
      CHECK_RESULT(delegate_->OnBrIfExpr(cast<BrIfExpr>(expr)));
      break;

    case ExprType::BrTable:
      CHECK_RESULT(delegate_->OnBrTableExpr(cast<BrTableExpr>(expr)));
      break;

    case ExprType::Call:
      CHECK_RESULT(delegate_->OnCallExpr(cast<CallExpr>(expr)));
      break;

    case ExprType::CallIndirect:
      CHECK_RESULT(delegate_->OnCallIndirectExpr(cast<CallIndirectExpr>(expr)));
      break;

    case ExprType::Compare:
      CHECK_RESULT(delegate_->OnCompareExpr(cast<CompareExpr>(expr)));
      break;

    case ExprType::Const:
      CHECK_RESULT(delegate_->OnConstExpr(cast<ConstExpr>(expr)));
      break;

    case ExprType::Convert:
      CHECK_RESULT(delegate_->OnConvertExpr(cast<ConvertExpr>(expr)));
      break;

    case ExprType::Drop:
      CHECK_RESULT(delegate_->OnDropExpr(cast<DropExpr>(expr)));
      break;

    case ExprType::GetGlobal:
      CHECK_RESULT(delegate_->OnGetGlobalExpr(cast<GetGlobalExpr>(expr)));
      break;

    case ExprType::GetLocal:
      CHECK_RESULT(delegate_->OnGetLocalExpr(cast<GetLocalExpr>(expr)));
      break;

    case ExprType::If: {
      auto if_expr = cast<IfExpr>(expr);
      CHECK_RESULT(delegate_->BeginIfExpr(if_expr));
      PushExprlist(State::IfTrue, expr, if_expr->true_.exprs);
      break;
    }

    case ExprType::IfExcept: {
      auto if_except_expr = cast<IfExceptExpr>(expr);
      CHECK_RESULT(delegate_->BeginIfExceptExpr(if_except_expr));
      PushExprlist(State::IfExceptTrue, expr, if_except_expr->true_.exprs);
      break;
    }

    case ExprType::Load:
      CHECK_RESULT(delegate_->OnLoadExpr(cast<LoadExpr>(expr)));
      break;

    case ExprType::Loop: {
      auto loop_expr = cast<LoopExpr>(expr);
      CHECK_RESULT(delegate_->BeginLoopExpr(loop_expr));
      PushExprlist(State::Loop, expr, loop_expr->block.exprs);
      break;
    }

    case ExprType::MemoryCopy:
      CHECK_RESULT(delegate_->OnMemoryCopyExpr(cast<MemoryCopyExpr>(expr)));
      break;

    case ExprType::MemoryDrop:
      CHECK_RESULT(delegate_->OnMemoryDropExpr(cast<MemoryDropExpr>(expr)));
      break;

    case ExprType::MemoryFill:
      CHECK_RESULT(delegate_->OnMemoryFillExpr(cast<MemoryFillExpr>(expr)));
      break;

    case ExprType::MemoryGrow:
      CHECK_RESULT(delegate_->OnMemoryGrowExpr(cast<MemoryGrowExpr>(expr)));
      break;

    case ExprType::MemoryInit:
      CHECK_RESULT(delegate_->OnMemoryInitExpr(cast<MemoryInitExpr>(expr)));
      break;

    case ExprType::MemorySize:
      CHECK_RESULT(delegate_->OnMemorySizeExpr(cast<MemorySizeExpr>(expr)));
      break;

    case ExprType::TableCopy:
      CHECK_RESULT(delegate_->OnTableCopyExpr(cast<TableCopyExpr>(expr)));
      break;

    case ExprType::TableDrop:
      CHECK_RESULT(delegate_->OnTableDropExpr(cast<TableDropExpr>(expr)));
      break;

    case ExprType::TableInit:
      CHECK_RESULT(delegate_->OnTableInitExpr(cast<TableInitExpr>(expr)));
      break;

    case ExprType::Nop:
      CHECK_RESULT(delegate_->OnNopExpr(cast<NopExpr>(expr)));
      break;

    case ExprType::Rethrow:
      CHECK_RESULT(delegate_->OnRethrowExpr(cast<RethrowExpr>(expr)));
      break;

    case ExprType::Return:
      CHECK_RESULT(delegate_->OnReturnExpr(cast<ReturnExpr>(expr)));
      break;

    case ExprType::ReturnCall:
      CHECK_RESULT(delegate_->OnReturnCallExpr(cast<ReturnCallExpr>(expr)));
      break;

    case ExprType::ReturnCallIndirect:
      CHECK_RESULT(delegate_->OnReturnCallIndirectExpr(
          cast<ReturnCallIndirectExpr>(expr)));
      break;

    case ExprType::Select:
      CHECK_RESULT(delegate_->OnSelectExpr(cast<SelectExpr>(expr)));
      break;

    case ExprType::SetGlobal:
      CHECK_RESULT(delegate_->OnSetGlobalExpr(cast<SetGlobalExpr>(expr)));
      break;

    case ExprType::SetLocal:
      CHECK_RESULT(delegate_->OnSetLocalExpr(cast<SetLocalExpr>(expr)));
      break;

    case ExprType::Store:
      CHECK_RESULT(delegate_->OnStoreExpr(cast<StoreExpr>(expr)));
      break;

    case ExprType::TeeLocal:
      CHECK_RESULT(delegate_->OnTeeLocalExpr(cast<TeeLocalExpr>(expr)));
      break;

    case ExprType::Throw:
      CHECK_RESULT(delegate_->OnThrowExpr(cast<ThrowExpr>(expr)));
      break;

    case ExprType::Try: {
      auto try_expr = cast<TryExpr>(expr);
      CHECK_RESULT(delegate_->BeginTryExpr(try_expr));
      PushExprlist(State::Try, expr, try_expr->block.exprs);
      break;
    }

    case ExprType::Unary:
      CHECK_RESULT(delegate_->OnUnaryExpr(cast<UnaryExpr>(expr)));
      break;

    case ExprType::Ternary:
      CHECK_RESULT(delegate_->OnTernaryExpr(cast<TernaryExpr>(expr)));
      break;

    case ExprType::SimdLaneOp: {
      CHECK_RESULT(delegate_->OnSimdLaneOpExpr(cast<SimdLaneOpExpr>(expr)));
      break;
    }

    case ExprType::SimdShuffleOp: {
      CHECK_RESULT(
          delegate_->OnSimdShuffleOpExpr(cast<SimdShuffleOpExpr>(expr)));
      break;
    }

    case ExprType::Unreachable:
      CHECK_RESULT(delegate_->OnUnreachableExpr(cast<UnreachableExpr>(expr)));
      break;
  }

  return Result::Ok;
}